

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O2

int png_colorspace_set_xy_and_XYZ
              (png_const_structrp png_ptr,png_colorspacerp colorspace,png_xy *xy,png_XYZ *XYZ,
              int preferred)

{
  ushort uVar1;
  png_fixed_point pVar2;
  png_fixed_point pVar3;
  png_fixed_point pVar4;
  png_fixed_point pVar5;
  png_fixed_point pVar6;
  png_fixed_point pVar7;
  png_fixed_point pVar8;
  int iVar9;
  ushort uVar10;
  
  uVar1 = colorspace->flags;
  if ((short)uVar1 < 0) {
    return 0;
  }
  if ((uVar1 & 2) != 0 && preferred < 2) {
    iVar9 = png_colorspace_endpoints_match(xy,&colorspace->end_points_xy,100);
    if (iVar9 == 0) {
      colorspace->flags = uVar1 | 0x8000;
      png_benign_error(png_ptr,"inconsistent chromaticities");
      return 0;
    }
    if (preferred == 0) {
      return 1;
    }
  }
  pVar5 = xy->redx;
  pVar6 = xy->redy;
  pVar7 = xy->greenx;
  pVar8 = xy->greeny;
  pVar2 = xy->bluey;
  pVar3 = xy->whitex;
  pVar4 = xy->whitey;
  (colorspace->end_points_xy).bluex = xy->bluex;
  (colorspace->end_points_xy).bluey = pVar2;
  (colorspace->end_points_xy).whitex = pVar3;
  (colorspace->end_points_xy).whitey = pVar4;
  (colorspace->end_points_xy).redx = pVar5;
  (colorspace->end_points_xy).redy = pVar6;
  (colorspace->end_points_xy).greenx = pVar7;
  (colorspace->end_points_xy).greeny = pVar8;
  pVar2 = XYZ->red_Y;
  pVar3 = XYZ->red_Z;
  pVar4 = XYZ->green_X;
  pVar5 = XYZ->green_Y;
  pVar6 = XYZ->green_Z;
  pVar7 = XYZ->blue_X;
  pVar8 = XYZ->blue_Y;
  (colorspace->end_points_XYZ).red_X = XYZ->red_X;
  (colorspace->end_points_XYZ).red_Y = pVar2;
  (colorspace->end_points_XYZ).red_Z = pVar3;
  (colorspace->end_points_XYZ).green_X = pVar4;
  (colorspace->end_points_XYZ).green_Y = pVar5;
  (colorspace->end_points_XYZ).green_Z = pVar6;
  (colorspace->end_points_XYZ).blue_X = pVar7;
  (colorspace->end_points_XYZ).blue_Y = pVar8;
  (colorspace->end_points_XYZ).blue_Z = XYZ->blue_Z;
  iVar9 = png_colorspace_endpoints_match(xy,&sRGB_xy,1000);
  uVar10 = uVar1 | 0x42;
  if (iVar9 == 0) {
    uVar10 = uVar1 & 0x7fbd | 2;
  }
  colorspace->flags = uVar10;
  return 2;
}

Assistant:

static int
png_colorspace_set_xy_and_XYZ(png_const_structrp png_ptr,
    png_colorspacerp colorspace, const png_xy *xy, const png_XYZ *XYZ,
    int preferred)
{
   if ((colorspace->flags & PNG_COLORSPACE_INVALID) != 0)
      return 0;

   /* The consistency check is performed on the chromaticities; this factors out
    * variations because of the normalization (or not) of the end point Y
    * values.
    */
   if (preferred < 2 &&
       (colorspace->flags & PNG_COLORSPACE_HAVE_ENDPOINTS) != 0)
   {
      /* The end points must be reasonably close to any we already have.  The
       * following allows an error of up to +/-.001
       */
      if (png_colorspace_endpoints_match(xy, &colorspace->end_points_xy,
          100) == 0)
      {
         colorspace->flags |= PNG_COLORSPACE_INVALID;
         png_benign_error(png_ptr, "inconsistent chromaticities");
         return 0; /* failed */
      }

      /* Only overwrite with preferred values */
      if (preferred == 0)
         return 1; /* ok, but no change */
   }

   colorspace->end_points_xy = *xy;
   colorspace->end_points_XYZ = *XYZ;
   colorspace->flags |= PNG_COLORSPACE_HAVE_ENDPOINTS;

   /* The end points are normally quoted to two decimal digits, so allow +/-0.01
    * on this test.
    */
   if (png_colorspace_endpoints_match(xy, &sRGB_xy, 1000) != 0)
      colorspace->flags |= PNG_COLORSPACE_ENDPOINTS_MATCH_sRGB;

   else
      colorspace->flags &= PNG_COLORSPACE_CANCEL(
         PNG_COLORSPACE_ENDPOINTS_MATCH_sRGB);

   return 2; /* ok and changed */
}